

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlines.cpp
# Opt level: O3

void skiwi::inline_fl_not_equal(asmcode *code,compiler_options *param_2)

{
  operand local_44 [3];
  operation local_38 [2];
  
  local_44[1] = 2;
  local_44[0] = RAX;
  local_44[2] = 0x39;
  local_38[0] = ~CMPLTPD;
  local_38[1] = ~ADD;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_44 + 1,local_44,local_44 + 2,(unsigned_long *)local_38);
  local_44[1] = 2;
  local_44[0] = RBX;
  local_44[2] = 0x39;
  local_38[0] = ~CMPLTPD;
  local_38[1] = ~ADD;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_44 + 1,local_44,local_44 + 2,(unsigned_long *)local_38);
  local_38[0] = MOVSD;
  local_44[1] = 0x43;
  local_44[0] = MEM_RAX;
  local_44[2] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_38,local_44 + 1,local_44,(int *)(local_44 + 2));
  local_38[0] = MOVSD;
  local_44[1] = 0x44;
  local_44[0] = MEM_RBX;
  local_44[2] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_38,local_44 + 1,local_44,(int *)(local_44 + 2));
  local_38[0] = CMPEQPD;
  local_44[1] = 0x43;
  local_44[0] = XMM1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_38,local_44 + 1,local_44);
  local_38[0] = MOVMSKPD;
  local_44[1] = 9;
  local_44[0] = XMM0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_38,local_44 + 1,local_44);
  local_38[0] = AND;
  local_44[1] = 9;
  local_44[0] = NUMBER;
  local_44[2] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_38,local_44 + 1,local_44,(int *)(local_44 + 2));
  local_38[0] = XOR;
  local_44[1] = 9;
  local_44[0] = NUMBER;
  local_44[2] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_38,local_44 + 1,local_44,(int *)(local_44 + 2));
  local_38[0] = SHL;
  local_44[1] = 9;
  local_44[0] = NUMBER;
  local_44[2] = 3;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_38,local_44 + 1,local_44,(int *)(local_44 + 2));
  local_38[0] = 0x49;
  local_44[1] = 9;
  local_44[0] = NUMBER;
  local_44[2] = 7;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_38,local_44 + 1,local_44,(int *)(local_44 + 2));
  return;
}

Assistant:

void inline_fl_not_equal(ASM::asmcode& code, const compiler_options&)
  {
  code.add(ASM::asmcode::AND, ASM::asmcode::RAX, ASM::asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  code.add(ASM::asmcode::AND, ASM::asmcode::RBX, ASM::asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  code.add(ASM::asmcode::MOVSD, ASM::asmcode::XMM0, ASM::asmcode::MEM_RAX, CELLS(1));
  code.add(ASM::asmcode::MOVSD, ASM::asmcode::XMM1, ASM::asmcode::MEM_RBX, CELLS(1));
  code.add(ASM::asmcode::CMPEQPD, ASM::asmcode::XMM0, ASM::asmcode::XMM1);
  code.add(ASM::asmcode::MOVMSKPD, ASM::asmcode::RAX, ASM::asmcode::XMM0);
  code.add(ASM::asmcode::AND, ASM::asmcode::RAX, ASM::asmcode::NUMBER, 1);
  code.add(ASM::asmcode::XOR, ASM::asmcode::RAX, ASM::asmcode::NUMBER, 1);
  code.add(ASM::asmcode::SHL, ASM::asmcode::RAX, ASM::asmcode::NUMBER, 3);
  code.add(ASM::asmcode::OR, ASM::asmcode::RAX, ASM::asmcode::NUMBER, bool_f);
  }